

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

Am_Object get_icon(char *initial_name,char *obj_name)

{
  Am_Wrapper *pAVar1;
  Am_Object *pAVar2;
  Am_Object local_50 [3];
  Am_Image_Array local_38 [8];
  Am_Image_Array local_30 [8];
  Am_Image_Array icon;
  char *pathname;
  char *obj_name_local;
  char *initial_name_local;
  
  _icon = (char *)Am_Merge_Pathname(obj_name);
  Am_Image_Array::Am_Image_Array(local_30);
  Am_Image_Array::Am_Image_Array(local_38,_icon);
  Am_Image_Array::operator=(local_30,local_38);
  Am_Image_Array::~Am_Image_Array(local_38);
  if (_icon != (char *)0x0) {
    operator_delete__(_icon);
  }
  Am_Object::Create((char *)local_50);
  pAVar1 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_30);
  pAVar2 = (Am_Object *)Am_Object::Set((ushort)local_50,(Am_Wrapper *)0xb0,(ulong)pAVar1);
  Am_Object::Am_Object((Am_Object *)initial_name,pAVar2);
  Am_Object::~Am_Object(local_50);
  Am_Image_Array::~Am_Image_Array(local_30);
  return (Am_Object)(Am_Object_Data *)initial_name;
}

Assistant:

static Am_Object
get_icon(const char *initial_name, const char *obj_name)
{
  const char *pathname = Am_Merge_Pathname(initial_name);
  Am_Image_Array icon;
  icon = Am_Image_Array(pathname);
  delete[] pathname;
  return Am_Bitmap.Create(obj_name).Set(Am_IMAGE, icon);
}